

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O2

int rtr_sync(rtr_socket *rtr_socket)

{
  long lVar1;
  rtr_socket_state new_state;
  int iVar2;
  int iVar3;
  time_t in_RCX;
  long in_FS_OFFSET;
  int oldcancelstate;
  undefined1 uStack_10038;
  char cStack_10037;
  ushort uStack_10036;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    pthread_setcancelstate(0,&oldcancelstate);
    iVar2 = rtr_receive_pdu(rtr_socket,&uStack_10038,0x3c,in_RCX);
    pthread_setcancelstate(1,&oldcancelstate);
    if (iVar2 == -2) {
      new_state = RTR_ERROR_TRANSPORT;
LAB_00109a09:
      rtr_change_socket_state(rtr_socket,new_state);
LAB_00109ad2:
      iVar2 = -1;
LAB_00109ad5:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return iVar2;
      }
      __stack_chk_fail();
    }
    if (iVar2 < 0) goto LAB_00109ad2;
    if (cStack_10037 != '\0') {
      if (cStack_10037 != '\x03') {
        if (cStack_10037 == '\b') {
          lrtr_dbg("RTR Socket: Cache Reset PDU received");
          new_state = RTR_ERROR_NO_INCR_UPDATE_AVAIL;
          goto LAB_00109a09;
        }
        if (cStack_10037 == '\n') {
          rtr_handle_error_pdu(rtr_socket,&uStack_10038);
        }
        else {
          lrtr_dbg("RTR Socket: Expected Cache Response PDU but received PDU Type (Type: %u)");
          rtr_send_error_pdu_from_host
                    (rtr_socket,&uStack_10038,8,CORRUPT_DATA,
                     "Unexpected PDU received in data synchronisation",0x30);
        }
        goto LAB_00109ad2;
      }
      lrtr_dbg("RTR Socket: Cache Response PDU received");
      if (rtr_socket->request_session_id == true) {
        if (rtr_socket->last_update != 0) {
          lrtr_dbg("RTR Socket: Resetting Socket.");
          rtr_socket->last_update = 0;
          rtr_socket->is_resetting = true;
        }
        rtr_socket->session_id = (uint)uStack_10036;
      }
      else if (rtr_socket->session_id != (uint)uStack_10036) {
        rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
      }
      iVar2 = rtr_sync_receive_and_store_pdus(rtr_socket);
      if (iVar2 == -1) goto LAB_00109ad2;
      rtr_socket->request_session_id = false;
      iVar3 = lrtr_get_monotonic_time(&rtr_socket->last_update);
      iVar2 = 0;
      if (iVar3 != -1) goto LAB_00109ad5;
      lrtr_dbg("RTR Socket: get_monotonic_time(..) failed ");
      new_state = RTR_ERROR_FATAL;
      goto LAB_00109a09;
    }
    lrtr_dbg("RTR Socket: Ignoring Serial Notify");
  } while( true );
}

Assistant:

int rtr_sync(struct rtr_socket *rtr_socket)
{
	char pdu[RTR_MAX_PDU_LEN];
	enum pdu_type type;

	int oldcancelstate;

	do {
		pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, &oldcancelstate);
		int rtval = rtr_receive_pdu(rtr_socket, pdu, RTR_MAX_PDU_LEN, RTR_RECV_TIMEOUT);

		pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, &oldcancelstate);
		// If the cache has closed the connection and we don't have a
		// session_id (no packages where exchanged) we should downgrade.
		if (rtval == TR_CLOSED && rtr_socket->request_session_id) {
			RTR_DBG1("The cache server closed the connection and we have no session_id!");
			if (rtr_socket->version > RTR_PROTOCOL_MIN_SUPPORTED_VERSION) {
				RTR_DBG("Downgrading from %i to version %i", rtr_socket->version,
					rtr_socket->version - 1);
				rtr_socket->version = rtr_socket->version - 1;
				rtr_change_socket_state(rtr_socket, RTR_FAST_RECONNECT);
				return RTR_ERROR;
			}
		}

		if (rtval == TR_WOULDBLOCK) {
			rtr_change_socket_state(rtr_socket, RTR_ERROR_TRANSPORT);
			return RTR_ERROR;
		} else if (rtval < 0) {
			return RTR_ERROR;
		}

		type = rtr_get_pdu_type(pdu);
		if (type == SERIAL_NOTIFY)
			RTR_DBG1("Ignoring Serial Notify");

	} while (type == SERIAL_NOTIFY);

	switch (type) {
	case ERROR:
		rtr_handle_error_pdu(rtr_socket, pdu);
		return RTR_ERROR;
	case CACHE_RESET:
		RTR_DBG1("Cache Reset PDU received");
		rtr_change_socket_state(rtr_socket, RTR_ERROR_NO_INCR_UPDATE_AVAIL);
		return RTR_ERROR;
	case CACHE_RESPONSE:
		rtr_handle_cache_response_pdu(rtr_socket, pdu);
		break;
	default:
		RTR_DBG("Expected Cache Response PDU but received PDU Type (Type: %u)",
			((struct pdu_header *)pdu)->type);
		const char txt[] = "Unexpected PDU received in data synchronisation";

		rtr_send_error_pdu_from_host(rtr_socket, pdu, sizeof(struct pdu_header), CORRUPT_DATA, txt,
					     sizeof(txt));
		return RTR_ERROR;
	}

	// Receive all PDUs until EOD PDU
	if (rtr_sync_receive_and_store_pdus(rtr_socket) == RTR_ERROR)
		return RTR_ERROR;

	rtr_socket->request_session_id = false;
	if (rtr_set_last_update(rtr_socket) == RTR_ERROR)
		return RTR_ERROR;

	return RTR_SUCCESS;
}